

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-error.c
# Opt level: O1

int run_test_pipe_connect_to_file(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  int iVar3;
  long *plVar4;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_connect_t req;
  uv_pipe_t client;
  void *pvStack_ae8;
  undefined1 auStack_ae0 [112];
  uv_pipe_t uStack_a70;
  char acStack_988 [2047];
  undefined1 uStack_189;
  uv_loop_t *puStack_188;
  undefined8 uStack_178;
  code *pcStack_170;
  long local_168;
  long local_160;
  uv_connect_t local_158;
  uv_pipe_t local_f0;
  
  plVar4 = &local_168;
  pcStack_170 = (code *)0x1ad592;
  puVar2 = uv_default_loop();
  pcStack_170 = (code *)0x1ad5a1;
  iVar1 = uv_pipe_init(puVar2,&local_f0,0);
  local_158.data = (void *)(long)iVar1;
  local_168 = 0;
  if (local_158.data == (void *)0x0) {
    pcStack_170 = (code *)0x1ad5dc;
    uv_pipe_connect(&local_158,&local_f0,"test/fixtures/empty_file",connect_cb_file);
    pcStack_170 = (code *)0x1ad5e1;
    puVar2 = uv_default_loop();
    pcStack_170 = (code *)0x1ad5eb;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_168 = 1;
    local_160 = (long)close_cb_called;
    if (local_160 != 1) goto LAB_001ad694;
    local_168 = 1;
    local_160 = (long)connect_cb_called;
    if (local_160 != 1) goto LAB_001ad6a1;
    pcStack_170 = (code *)0x1ad632;
    unaff_RBX = uv_default_loop();
    pcStack_170 = (code *)0x1ad646;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_170 = (code *)0x1ad650;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_168 = 0;
    pcStack_170 = (code *)0x1ad65d;
    puVar2 = uv_default_loop();
    pcStack_170 = (code *)0x1ad665;
    iVar1 = uv_loop_close(puVar2);
    local_160 = (long)iVar1;
    if (local_168 == local_160) {
      pcStack_170 = (code *)0x1ad67c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_170 = (code *)0x1ad694;
    run_test_pipe_connect_to_file_cold_1();
LAB_001ad694:
    pcStack_170 = (code *)0x1ad6a1;
    run_test_pipe_connect_to_file_cold_2();
LAB_001ad6a1:
    pcStack_170 = (code *)0x1ad6ae;
    run_test_pipe_connect_to_file_cold_3();
  }
  iVar1 = (int)&local_160;
  pcStack_170 = connect_cb_file;
  run_test_pipe_connect_to_file_cold_4();
  if ((iVar1 == -0x58) || (iVar1 == -0xd)) {
LAB_001ad6e6:
    puStack_188 = (uv_loop_t *)0x1ad6f6;
    uv_close(*(uv_handle_t **)((long)plVar4 + 0x50),close_cb);
    connect_cb_called = connect_cb_called + 1;
    return extraout_EAX;
  }
  pcStack_170 = (code *)(long)iVar1;
  uStack_178 = 0xffffffffffffff91;
  if (pcStack_170 == (code *)0xffffffffffffff91) goto LAB_001ad6e6;
  puStack_188 = (uv_loop_t *)run_test_pipe_connect_to_long_path;
  connect_cb_file_cold_1();
  iVar3 = (int)&pvStack_ae8;
  puStack_188 = unaff_RBX;
  memset(acStack_988,0x2e,0x7ff);
  uStack_189 = 0;
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&uStack_a70,0);
  if (iVar1 == 0) {
    uv_pipe_connect((uv_connect_t *)(auStack_ae0 + 8),&uStack_a70,acStack_988,connect_cb_long_path);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_001ad7f3;
    if (connect_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_ae0._0_8_ = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      pvStack_ae8 = (void *)(long)iVar1;
      if ((void *)auStack_ae0._0_8_ == pvStack_ae8) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ad7fd;
    }
  }
  else {
    run_test_pipe_connect_to_long_path_cold_1();
LAB_001ad7f3:
    run_test_pipe_connect_to_long_path_cold_2();
  }
  run_test_pipe_connect_to_long_path_cold_3();
LAB_001ad7fd:
  handle = (uv_handle_t *)auStack_ae0;
  run_test_pipe_connect_to_long_path_cold_4();
  if (iVar3 == -0x24) {
    uv_close(*(uv_handle_t **)&handle[1].type,close_cb);
    connect_cb_called = connect_cb_called + 1;
    return extraout_EAX_00;
  }
  connect_cb_long_path_cold_1();
  if (handle != (uv_handle_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_01;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(pipe_connect_to_file) {
  const char* path = "test/fixtures/empty_file";
  uv_pipe_t client;
  uv_connect_t req;
  int r;

  r = uv_pipe_init(uv_default_loop(), &client, 0);
  ASSERT_OK(r);
  uv_pipe_connect(&req, &client, path, connect_cb_file);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);
  ASSERT_EQ(1, connect_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}